

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ProcessEvent>::copyConstruct
          (BasicTypeInfo<dap::ProcessEvent> *this,void *dst,void *src)

{
  *(undefined1 *)dst = *src;
  *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)src + 1);
  *(long *)((long)dst + 8) = (long)dst + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 8),*(long *)((long)src + 8),
             *(long *)((long)src + 0x10) + *(long *)((long)src + 8));
  *(undefined8 *)((long)dst + 0x28) = *(undefined8 *)((long)src + 0x28);
  *(undefined1 *)((long)dst + 0x30) = *(undefined1 *)((long)src + 0x30);
  *(long *)((long)dst + 0x38) = (long)dst + 0x48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x38),*(long *)((long)src + 0x38),
             *(long *)((long)src + 0x40) + *(long *)((long)src + 0x38));
  *(undefined1 *)((long)dst + 0x58) = *(undefined1 *)((long)src + 0x58);
  *(undefined8 *)((long)dst + 0x60) = *(undefined8 *)((long)src + 0x60);
  *(undefined1 *)((long)dst + 0x68) = *(undefined1 *)((long)src + 0x68);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }